

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O1

bool __thiscall
CoinStatsIndex::CustomInit(CoinStatsIndex *this,optional<interfaces::BlockRef> *block)

{
  long lVar1;
  bool bVar2;
  int source_line;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  uint256 out;
  DBVal entry;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CDBWrapper::Read<unsigned_char,MuHash3072>
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,"M14CoinStatsIndex",&this->m_muhash);
  if ((bVar2) ||
     (bVar2 = CDBWrapper::Exists<unsigned_char>
                        (&((this->m_db)._M_t.
                           super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                           .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                          super_CDBWrapper,"M14CoinStatsIndex"), !bVar2)) {
    if ((block->super__Optional_base<interfaces::BlockRef,_true,_true>)._M_payload.
        super__Optional_payload_base<interfaces::BlockRef>._M_engaged != true) {
LAB_0089de29:
      bVar2 = true;
      goto LAB_0089de2b;
    }
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    entry.muhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    bVar2 = LookUpOne(&((this->m_db)._M_t.
                        super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                        .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                       super_CDBWrapper,(BlockRef *)block,&entry);
    if (!bVar2) {
      source_line = 0x172;
      goto LAB_0089ddba;
    }
    out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    MuHash3072::Finalize(&this->m_muhash,&out);
    auVar3[0] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar3[1] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar3[2] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar3[3] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar3[4] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar3[5] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar3[6] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar3[7] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar3[8] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar3[9] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                 out.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar3[10] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                  out.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar3[0xb] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                   out.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar3[0xc] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                   out.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar3[0xd] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                   out.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar3[0xe] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                   out.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar3[0xf] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                   out.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar4[0] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0] ==
                 out.super_base_blob<256U>.m_data._M_elems[0]);
    auVar4[1] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[1] ==
                 out.super_base_blob<256U>.m_data._M_elems[1]);
    auVar4[2] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[2] ==
                 out.super_base_blob<256U>.m_data._M_elems[2]);
    auVar4[3] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[3] ==
                 out.super_base_blob<256U>.m_data._M_elems[3]);
    auVar4[4] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[4] ==
                 out.super_base_blob<256U>.m_data._M_elems[4]);
    auVar4[5] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[5] ==
                 out.super_base_blob<256U>.m_data._M_elems[5]);
    auVar4[6] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[6] ==
                 out.super_base_blob<256U>.m_data._M_elems[6]);
    auVar4[7] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[7] ==
                 out.super_base_blob<256U>.m_data._M_elems[7]);
    auVar4[8] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[8] ==
                 out.super_base_blob<256U>.m_data._M_elems[8]);
    auVar4[9] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[9] ==
                 out.super_base_blob<256U>.m_data._M_elems[9]);
    auVar4[10] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[10] ==
                  out.super_base_blob<256U>.m_data._M_elems[10]);
    auVar4[0xb] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                   out.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar4[0xc] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                   out.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar4[0xd] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                   out.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar4[0xe] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                   out.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar4[0xf] = -(entry.muhash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                   out.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar4 = auVar4 & auVar3;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
      this->m_transaction_output_count = entry.transaction_output_count;
      this->m_bogo_size = entry.bogo_size;
      this->m_total_amount = entry.total_amount;
      this->m_total_subsidy = entry.total_subsidy;
      this->m_total_unspendable_amount = entry.total_unspendable_amount;
      this->m_total_prevout_spent_amount = entry.total_prevout_spent_amount;
      this->m_total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
      this->m_total_coinbase_amount = entry.total_coinbase_amount;
      this->m_total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
      this->m_total_unspendables_bip30 = entry.total_unspendables_bip30;
      this->m_total_unspendables_scripts = entry.total_unspendables_scripts;
      this->m_total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;
      goto LAB_0089de29;
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
    ;
    source_file._M_len = 0x68;
    logging_function._M_str = "CustomInit";
    logging_function._M_len = 10;
    LogPrintFormatInternal<char[11],std::__cxx11::string>
              (logging_function,source_file,0x17a,ALL,Error,(ConstevalFormatString<2U>)0xf927dd,
               (char (*) [11])"CustomInit",&(this->super_BaseIndex).m_name);
  }
  else {
    source_line = 0x169;
LAB_0089ddba:
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/coinstatsindex.cpp"
    ;
    source_file_00._M_len = 0x68;
    logging_function_00._M_str = "CustomInit";
    logging_function_00._M_len = 10;
    LogPrintFormatInternal<char[11],std::__cxx11::string>
              (logging_function_00,source_file_00,source_line,ALL,Error,
               (ConstevalFormatString<2U>)0xf927dd,(char (*) [11])"CustomInit",
               &(this->super_BaseIndex).m_name);
  }
  bVar2 = false;
LAB_0089de2b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CoinStatsIndex::CustomInit(const std::optional<interfaces::BlockRef>& block)
{
    if (!m_db->Read(DB_MUHASH, m_muhash)) {
        // Check that the cause of the read failure is that the key does not
        // exist. Any other errors indicate database corruption or a disk
        // failure, and starting the index would cause further corruption.
        if (m_db->Exists(DB_MUHASH)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }
    }

    if (block) {
        DBVal entry;
        if (!LookUpOne(*m_db, *block, entry)) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        uint256 out;
        m_muhash.Finalize(out);
        if (entry.muhash != out) {
            LogError("%s: Cannot read current %s state; index may be corrupted\n",
                         __func__, GetName());
            return false;
        }

        m_transaction_output_count = entry.transaction_output_count;
        m_bogo_size = entry.bogo_size;
        m_total_amount = entry.total_amount;
        m_total_subsidy = entry.total_subsidy;
        m_total_unspendable_amount = entry.total_unspendable_amount;
        m_total_prevout_spent_amount = entry.total_prevout_spent_amount;
        m_total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
        m_total_coinbase_amount = entry.total_coinbase_amount;
        m_total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
        m_total_unspendables_bip30 = entry.total_unspendables_bip30;
        m_total_unspendables_scripts = entry.total_unspendables_scripts;
        m_total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;
    }

    return true;
}